

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw.h
# Opt level: O0

void VW::init_features(primitive_feature_space *fs,size_t features_count)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  feature *pfVar3;
  ulong in_RSI;
  long in_RDI;
  feature *local_38;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RSI;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pfVar3 = (feature *)operator_new__(uVar2);
  if (in_RSI != 0) {
    local_38 = pfVar3;
    do {
      ::feature::feature(local_38);
      local_38 = local_38 + 1;
    } while (local_38 != pfVar3 + in_RSI);
  }
  *(feature **)(in_RDI + 8) = pfVar3;
  *(ulong *)(in_RDI + 0x10) = in_RSI;
  return;
}

Assistant:

inline void init_features(primitive_feature_space& fs, size_t features_count) {
  fs.fs = new feature[features_count];
  fs.len = features_count;
}